

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_info_manager.cpp
# Opt level: O3

void __thiscall
spvtools::opt::analysis::DebugInfoManager::ClearDebugInfo(DebugInfoManager *this,Instruction *instr)

{
  _Head_base<0UL,_spvtools::opt::Module_*,_false> _Var1;
  CommonDebugInfoInstructions CVar2;
  uint32_t uVar3;
  OpenCLDebugInfo100Instructions OVar4;
  NonSemanticShaderDebugInfo100Instructions_conflict NVar5;
  iterator iVar6;
  iterator iVar7;
  IRContext *pIVar8;
  Instruction *pIVar9;
  pair<std::_Rb_tree_iterator<spvtools::opt::Instruction_*>,_std::_Rb_tree_iterator<spvtools::opt::Instruction_*>_>
  pVar10;
  uint32_t fn_id;
  Instruction *local_28;
  uint32_t local_1c;
  
  local_1c = (instr->dbg_scope_).lexical_scope_;
  local_28 = instr;
  iVar6 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->scope_id_to_users_)._M_h,&local_1c);
  if (iVar6.
      super__Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false>
      ._M_cur != (__node_type *)0x0) {
    std::
    _Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::_M_erase((_Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)((long)iVar6.
                         super__Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false>
                         ._M_cur + 0x10),&local_28);
    instr = local_28;
  }
  local_1c = (instr->dbg_scope_).inlined_at_;
  iVar6 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->inlinedat_id_to_users_)._M_h,&local_1c);
  if (iVar6.
      super__Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false>
      ._M_cur != (__node_type *)0x0) {
    std::
    _Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::_M_erase((_Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)((long)iVar6.
                         super__Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false>
                         ._M_cur + 0x10),&local_28);
  }
  if ((local_28 != (Instruction *)0x0) &&
     (CVar2 = Instruction::GetCommonDebugOpcode(local_28), CVar2 != CommonDebugInfoInstructionsMax))
  {
    uVar3 = 0;
    if (local_28->has_result_id_ == true) {
      uVar3 = Instruction::GetSingleWordOperand(local_28,(uint)local_28->has_type_id_);
    }
    local_1c = uVar3;
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::_M_erase(&(this->id_to_dbg_inst_)._M_h);
    OVar4 = Instruction::GetOpenCL100DebugOpcode(local_28);
    if (OVar4 == OpenCLDebugInfo100DebugFunction) {
      local_1c = Instruction::GetSingleWordOperand(local_28,0xd);
      std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::_M_erase(&(this->fn_id_to_dbg_fn_)._M_h);
    }
    NVar5 = Instruction::GetShader100DebugOpcode(local_28);
    if (NVar5 == NonSemanticShaderDebugInfo100DebugFunctionDefinition) {
      local_1c = Instruction::GetSingleWordOperand(local_28,5);
      std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::_M_erase(&(this->fn_id_to_dbg_fn_)._M_h);
    }
    CVar2 = Instruction::GetCommonDebugOpcode(local_28);
    if ((CVar2 == CommonDebugInfoDebugDeclare) ||
       (CVar2 = Instruction::GetCommonDebugOpcode(local_28), CVar2 == CommonDebugInfoDebugValue)) {
      local_1c = Instruction::GetSingleWordOperand(local_28,5);
      iVar7 = std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::set<spvtools::opt::Instruction_*,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::opt::Instruction_*,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&(this->var_id_to_dbg_decl_)._M_h,&local_1c);
      if (iVar7.
          super__Node_iterator_base<std::pair<const_unsigned_int,_std::set<spvtools::opt::Instruction_*,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false>
          ._M_cur != (__node_type *)0x0) {
        pVar10 = std::
                 _Rb_tree<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::_Identity<spvtools::opt::Instruction_*>,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>
                 ::equal_range((_Rb_tree<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::_Identity<spvtools::opt::Instruction_*>,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>
                                *)((long)iVar7.
                                         super__Node_iterator_base<std::pair<const_unsigned_int,_std::set<spvtools::opt::Instruction_*,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false>
                                         ._M_cur + 0x10),&local_28);
        std::
        _Rb_tree<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::_Identity<spvtools::opt::Instruction_*>,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>
        ::_M_erase_aux((_Rb_tree<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::_Identity<spvtools::opt::Instruction_*>,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>
                        *)((long)iVar7.
                                 super__Node_iterator_base<std::pair<const_unsigned_int,_std::set<spvtools::opt::Instruction_*,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false>
                                 ._M_cur + 0x10),(_Base_ptr)pVar10.first._M_node,
                       (_Base_ptr)pVar10.second._M_node);
      }
    }
    if (this->deref_operation_ == local_28) {
      this->deref_operation_ = (Instruction *)0x0;
      _Var1._M_head_impl =
           (this->context_->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
      pIVar9 = *(Instruction **)((long)&(_Var1._M_head_impl)->ext_inst_debuginfo_ + 0x10);
      if (pIVar9 != (Instruction *)((long)&(_Var1._M_head_impl)->ext_inst_debuginfo_ + 8U)) {
        do {
          if ((((local_28 != pIVar9) &&
               (OVar4 = Instruction::GetOpenCL100DebugOpcode(pIVar9),
               OVar4 == OpenCLDebugInfo100DebugOperation)) &&
              (uVar3 = Instruction::GetSingleWordOperand(pIVar9,4), uVar3 == 0)) ||
             (((local_28 != pIVar9 &&
               (NVar5 = Instruction::GetShader100DebugOpcode(pIVar9),
               NVar5 == NonSemanticShaderDebugInfo100DebugOperation)) &&
              (uVar3 = GetVulkanDebugOperation(this,pIVar9), uVar3 == 0)))) {
            this->deref_operation_ = pIVar9;
            break;
          }
          pIVar9 = (pIVar9->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
        } while (pIVar9 != (Instruction *)
                           ((long)&((this->context_->module_)._M_t.
                                    super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                                    .super__Head_base<0UL,_spvtools::opt::Module_*,_false>.
                                   _M_head_impl)->ext_inst_debuginfo_ + 8U));
      }
    }
    if (this->debug_info_none_inst_ == local_28) {
      this->debug_info_none_inst_ = (Instruction *)0x0;
      pIVar8 = this->context_;
      _Var1._M_head_impl =
           (pIVar8->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
      pIVar9 = *(Instruction **)((long)&(_Var1._M_head_impl)->ext_inst_debuginfo_ + 0x10);
      if (pIVar9 != (Instruction *)((long)&(_Var1._M_head_impl)->ext_inst_debuginfo_ + 8U)) {
        do {
          if (local_28 != pIVar9) {
            CVar2 = Instruction::GetCommonDebugOpcode(pIVar9);
            if (CVar2 == CommonDebugInfoDebugInfoNone) {
              this->debug_info_none_inst_ = pIVar9;
              break;
            }
            pIVar8 = this->context_;
          }
          pIVar9 = (pIVar9->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
        } while (pIVar9 != (Instruction *)
                           ((long)&((pIVar8->module_)._M_t.
                                    super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                                    .super__Head_base<0UL,_spvtools::opt::Module_*,_false>.
                                   _M_head_impl)->ext_inst_debuginfo_ + 8U));
      }
    }
    if (this->empty_debug_expr_inst_ == local_28) {
      this->empty_debug_expr_inst_ = (Instruction *)0x0;
      _Var1._M_head_impl =
           (this->context_->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
      pIVar9 = *(Instruction **)((long)&(_Var1._M_head_impl)->ext_inst_debuginfo_ + 0x10);
      if (pIVar9 != (Instruction *)((long)&(_Var1._M_head_impl)->ext_inst_debuginfo_ + 8U)) {
        do {
          if (((local_28 != pIVar9) &&
              (CVar2 = Instruction::GetCommonDebugOpcode(pIVar9),
              CVar2 == CommonDebugInfoDebugExpression)) &&
             ((int)((ulong)((long)(pIVar9->operands_).
                                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pIVar9->operands_).
                                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 == 4
             )) {
            this->empty_debug_expr_inst_ = pIVar9;
            return;
          }
          pIVar9 = (pIVar9->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
        } while (pIVar9 != (Instruction *)
                           ((long)&((this->context_->module_)._M_t.
                                    super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                                    .super__Head_base<0UL,_spvtools::opt::Module_*,_false>.
                                   _M_head_impl)->ext_inst_debuginfo_ + 8U));
      }
    }
  }
  return;
}

Assistant:

void DebugInfoManager::ClearDebugInfo(Instruction* instr) {
  auto scope_id_to_users_itr =
      scope_id_to_users_.find(instr->GetDebugScope().GetLexicalScope());
  if (scope_id_to_users_itr != scope_id_to_users_.end()) {
    scope_id_to_users_itr->second.erase(instr);
  }
  auto inlinedat_id_to_users_itr =
      inlinedat_id_to_users_.find(instr->GetDebugInlinedAt());
  if (inlinedat_id_to_users_itr != inlinedat_id_to_users_.end()) {
    inlinedat_id_to_users_itr->second.erase(instr);
  }

  if (instr == nullptr || !instr->IsCommonDebugInstr()) {
    return;
  }

  id_to_dbg_inst_.erase(instr->result_id());

  if (instr->GetOpenCL100DebugOpcode() == OpenCLDebugInfo100DebugFunction) {
    auto fn_id =
        instr->GetSingleWordOperand(kDebugFunctionOperandFunctionIndex);
    fn_id_to_dbg_fn_.erase(fn_id);
  }
  if (instr->GetShader100DebugOpcode() ==
      NonSemanticShaderDebugInfo100DebugFunctionDefinition) {
    auto fn_id = instr->GetSingleWordOperand(
        kDebugFunctionDefinitionOperandOpFunctionIndex);
    fn_id_to_dbg_fn_.erase(fn_id);
  }

  if (instr->GetCommonDebugOpcode() == CommonDebugInfoDebugDeclare ||
      instr->GetCommonDebugOpcode() == CommonDebugInfoDebugValue) {
    auto var_or_value_id =
        instr->GetSingleWordOperand(kDebugDeclareOperandVariableIndex);
    auto dbg_decl_itr = var_id_to_dbg_decl_.find(var_or_value_id);
    if (dbg_decl_itr != var_id_to_dbg_decl_.end()) {
      dbg_decl_itr->second.erase(instr);
    }
  }

  if (deref_operation_ == instr) {
    deref_operation_ = nullptr;
    for (auto dbg_instr_itr = context()->module()->ext_inst_debuginfo_begin();
         dbg_instr_itr != context()->module()->ext_inst_debuginfo_end();
         ++dbg_instr_itr) {
      // OpenCL.DebugInfo.100 contains the operation as a literal operand, in
      // Vulkan it's referenced as an OpConstant.
      if (instr != &*dbg_instr_itr &&
          dbg_instr_itr->GetOpenCL100DebugOpcode() ==
              OpenCLDebugInfo100DebugOperation &&
          dbg_instr_itr->GetSingleWordOperand(
              kDebugOperationOperandOperationIndex) ==
              OpenCLDebugInfo100Deref) {
        deref_operation_ = &*dbg_instr_itr;
        break;
      } else if (instr != &*dbg_instr_itr &&
                 dbg_instr_itr->GetShader100DebugOpcode() ==
                     NonSemanticShaderDebugInfo100DebugOperation) {
        uint32_t operation_const = GetVulkanDebugOperation(&*dbg_instr_itr);
        if (operation_const == NonSemanticShaderDebugInfo100Deref) {
          deref_operation_ = &*dbg_instr_itr;
          break;
        }
      }
    }
  }

  if (debug_info_none_inst_ == instr) {
    debug_info_none_inst_ = nullptr;
    for (auto dbg_instr_itr = context()->module()->ext_inst_debuginfo_begin();
         dbg_instr_itr != context()->module()->ext_inst_debuginfo_end();
         ++dbg_instr_itr) {
      if (instr != &*dbg_instr_itr && dbg_instr_itr->GetCommonDebugOpcode() ==
                                          CommonDebugInfoDebugInfoNone) {
        debug_info_none_inst_ = &*dbg_instr_itr;
        break;
      }
    }
  }

  if (empty_debug_expr_inst_ == instr) {
    empty_debug_expr_inst_ = nullptr;
    for (auto dbg_instr_itr = context()->module()->ext_inst_debuginfo_begin();
         dbg_instr_itr != context()->module()->ext_inst_debuginfo_end();
         ++dbg_instr_itr) {
      if (instr != &*dbg_instr_itr && IsEmptyDebugExpression(&*dbg_instr_itr)) {
        empty_debug_expr_inst_ = &*dbg_instr_itr;
        break;
      }
    }
  }
}